

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  byte bVar1;
  int32_t iVar2;
  int32_t iVar3;
  invalid_argument *piVar4;
  void *this_00;
  element_type *peVar5;
  real *prVar6;
  element_type *peVar7;
  Dictionary *in_RSI;
  EVP_PKEY_CTX *ctx;
  size_t j_1;
  int32_t idx;
  size_t i_1;
  size_t j;
  string word;
  size_t i;
  int64_t dim;
  int64_t n;
  shared_ptr<fasttext::Matrix> mat;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  ifstream in;
  shared_ptr<fasttext::Matrix> *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  real in_stack_fffffffffffffba4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba8;
  Dictionary *in_stack_fffffffffffffbb0;
  long *in_stack_fffffffffffffbc0;
  undefined4 in_stack_fffffffffffffbc8;
  real in_stack_fffffffffffffbcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  Matrix *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe8;
  int in_stack_fffffffffffffbec;
  string *in_stack_fffffffffffffc18;
  int64_t in_stack_fffffffffffffc40;
  pointer pfVar8;
  undefined4 in_stack_fffffffffffffc48;
  undefined4 in_stack_fffffffffffffc4c;
  Dictionary *in_stack_fffffffffffffc50;
  ulong __n;
  undefined1 local_3a0 [56];
  ulong local_368;
  undefined1 local_349;
  string local_2a8 [39];
  undefined1 local_281;
  string local_280 [48];
  pointer local_250;
  ulong local_248 [3];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_230;
  istream local_218 [536];
  
  std::ifstream::ifstream(local_218,(string *)in_RSI,_S_in);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x16e2e6);
  std::shared_ptr<fasttext::Matrix>::shared_ptr((shared_ptr<fasttext::Matrix> *)0x16e2f3);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    local_281 = 1;
    piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
                   (char *)in_stack_fffffffffffffbc0);
    std::invalid_argument::invalid_argument(piVar4,local_280);
    local_281 = 0;
    __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  this_00 = (void *)std::istream::operator>>(local_218,(long *)local_248);
  std::istream::operator>>(this_00,(long *)&local_250);
  pfVar8 = local_250;
  peVar5 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x16e449);
  if (pfVar8 == (pointer)(long)peVar5->dim) {
    std::make_shared<fasttext::Matrix,long&,long&>
              ((long *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               in_stack_fffffffffffffbc0);
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16e6a8);
    for (local_368 = 0; local_368 < local_248[0]; local_368 = local_368 + 1) {
      std::__cxx11::string::string((string *)(local_3a0 + 0x18));
      std::operator>>(local_218,(string *)(local_3a0 + 0x18));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16e718);
      Dictionary::add(in_RSI,in_stack_fffffffffffffc18);
      for (local_3a0._16_8_ = (pointer)0x0; (ulong)local_3a0._16_8_ < local_250;
          local_3a0._16_8_ = local_3a0._16_8_ + 1) {
        std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x16e755);
        prVar6 = Matrix::at((Matrix *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                            (int64_t)in_stack_fffffffffffffb98,0x16e76d);
        std::istream::operator>>(local_218,prVar6);
      }
      std::__cxx11::string::~string((string *)(local_3a0 + 0x18));
    }
    std::ifstream::close();
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x16e80c);
    ctx = (EVP_PKEY_CTX *)0x1;
    Dictionary::threshold
              (in_stack_fffffffffffffc50,
               CONCAT44(in_stack_fffffffffffffc4c,in_stack_fffffffffffffc48),
               in_stack_fffffffffffffc40);
    peVar7 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16e830);
    Dictionary::init(peVar7,ctx);
    peVar7 = std::
             __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16e84b);
    Dictionary::nwords(peVar7);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16e866);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16e886);
    std::make_shared<fasttext::Matrix,int,int&>
              ((int *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               (int *)in_stack_fffffffffffffbc0);
    this_01 = (Matrix *)local_3a0;
    std::shared_ptr<fasttext::Matrix>::operator=
              ((shared_ptr<fasttext::Matrix> *)
               CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
               in_stack_fffffffffffffb98);
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16e8d1);
    std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16e8db);
    std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x16e8ed);
    Matrix::uniform(this_01,in_stack_fffffffffffffbcc);
    for (__n = 0; __n < local_248[0]; __n = __n + 1) {
      std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x16e941);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_230,__n);
      iVar2 = Dictionary::getId(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
      if (-1 < iVar2) {
        peVar7 = std::
                 __shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x16e99f);
        iVar3 = Dictionary::nwords(peVar7);
        if (iVar2 < iVar3) {
          for (pfVar8 = (pointer)0x0; pfVar8 < local_250; pfVar8 = (pointer)((long)pfVar8 + 1)) {
            std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16e9ed);
            in_stack_fffffffffffffbb0 =
                 (Dictionary *)
                 Matrix::at((Matrix *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                            (int64_t)in_stack_fffffffffffffb98,0x16ea05);
            in_stack_fffffffffffffba4 =
                 *(real *)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              *)&in_stack_fffffffffffffbb0->args_)->_M_impl).super__Vector_impl_data
                           ._M_start;
            std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x16ea2c);
            in_stack_fffffffffffffba8 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 Matrix::at((Matrix *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),
                            (int64_t)in_stack_fffffffffffffb98,0x16ea44);
            *(real *)in_stack_fffffffffffffba8 = in_stack_fffffffffffffba4;
          }
        }
      }
    }
    std::shared_ptr<fasttext::Matrix>::~shared_ptr((shared_ptr<fasttext::Matrix> *)0x16ea9b);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)in_stack_fffffffffffffbb0);
    std::ifstream::~ifstream(local_218);
    return;
  }
  local_349 = 1;
  piVar4 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
  std::operator+((char *)in_stack_fffffffffffffba8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  std::operator+(in_stack_fffffffffffffba8,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x16e4d5);
  std::__cxx11::to_string(in_stack_fffffffffffffbec);
  std::operator+(in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0);
  std::operator+(in_stack_fffffffffffffba8,
                 (char *)CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0));
  std::invalid_argument::invalid_argument(piVar4,local_2a8);
  local_349 = 0;
  __cxa_throw(piVar4,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::loadVectors(std::string filename) {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    throw std::invalid_argument(filename + " cannot be opened for loading!");
  }
  in >> n >> dim;
  if (dim != args_->dim) {
    throw std::invalid_argument(
        "Dimension of pretrained vectors (" + std::to_string(dim) +
        ") does not match dimension (" + std::to_string(args_->dim) + ")!");
  }
  mat = std::make_shared<Matrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    dict_->add(word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->at(i, j);
    }
  }
  in.close();

  dict_->threshold(1, 0);
  dict_->init();
  input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
  input_->uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getId(words[i]);
    if (idx < 0 || idx >= dict_->nwords()) continue;
    for (size_t j = 0; j < dim; j++) {
      input_->at(idx, j) = mat->at(i, j);
    }
  }
}